

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::UniformCase::getActiveUniforms
          (UniformCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
          *basicUniformReportsDst,
          vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,deUint32 programGL)

{
  int *value;
  TestLog *pTVar1;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  *pvVar2;
  bool bVar3;
  __type_conflict _Var4;
  GLenum GVar5;
  DataType dataType;
  deBool dVar6;
  int iVar7;
  char *pcVar8;
  const_iterator cVar9;
  TestError *this_00;
  ulong uVar10;
  pointer pBVar11;
  long lVar12;
  CallLogWrapper *this_01;
  string *psVar13;
  long lVar14;
  GLint reportedSize;
  GLsizei reportedNameLength;
  GLint uniformMaxNameLength;
  int local_2d8;
  deUint32 local_2d4;
  GLenum reportedTypeGL;
  GLint numActiveUniforms;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  *local_2c8;
  ulong local_2c0;
  string reportedNameStr;
  vector<char,_std::allocator<char>_> nameBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  undefined1 local_230 [8];
  ostream local_228;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  numActiveUniforms = 0;
  uniformMaxNameLength = 0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_01 = &this->super_CallLogWrapper;
  local_2d4 = programGL;
  glu::CallLogWrapper::glGetProgramiv(this_01,programGL,0x8b86,&numActiveUniforms);
  GVar5 = glu::CallLogWrapper::glGetError(this_01);
  glu::checkError(GVar5,"glGetProgramiv(programGL, GL_ACTIVE_UNIFORMS, &numActiveUniforms)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                  ,0x5ba);
  local_230 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
  std::operator<<(&local_228,"// Number of active uniforms reported: ");
  std::ostream::operator<<((ostringstream *)&local_228,numActiveUniforms);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
  glu::CallLogWrapper::glGetProgramiv(this_01,local_2d4,0x8b87,&uniformMaxNameLength);
  GVar5 = glu::CallLogWrapper::glGetError(this_01);
  glu::checkError(GVar5,
                  "glGetProgramiv(programGL, GL_ACTIVE_UNIFORM_MAX_LENGTH, &uniformMaxNameLength)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                  ,0x5bc);
  local_230 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
  std::operator<<(&local_228,"// Maximum uniform name length reported: ");
  std::ostream::operator<<((ostringstream *)&local_228,uniformMaxNameLength);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
  std::vector<char,_std::allocator<char>_>::resize(&nameBuffer,(long)uniformMaxNameLength);
  bVar3 = true;
  uVar10 = 0;
  local_2c8 = basicUniformReportsDst;
  do {
    pvVar2 = local_2c8;
    if (numActiveUniforms <= (int)(GLuint)uVar10) {
      lVar12 = 0;
      for (lVar14 = 0;
          pBVar11 = (basicUniformReportsRef->
                    super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                    )._M_impl.super__Vector_impl_data._M_start,
          lVar14 < (int)(((long)(basicUniformReportsRef->
                                super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11) / 0x30)
          ; lVar14 = lVar14 + 1) {
        if ((&pBVar11->isUsedInShader)[lVar12] == true) {
          psVar13 = (string *)((long)&(pBVar11->name)._M_dataplus._M_p + lVar12);
          cVar9 = BasicUniformReportGL::findWithName(pvVar2,*(char **)psVar13);
          if (cVar9._M_current ==
              (pvVar2->
              super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_230 = (undefined1  [8])pTVar1;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
            std::operator<<(&local_228,"// FAILURE: uniform with name ");
            std::operator<<(&local_228,psVar13);
            std::operator<<(&local_228," was not reported by GL");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
            bVar3 = false;
          }
        }
        lVar12 = lVar12 + 0x30;
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&nameBuffer.super__Vector_base<char,_std::allocator<char>_>);
      return bVar3;
    }
    reportedNameLength = 0;
    reportedSize = -1;
    reportedTypeGL = 0;
    local_2c0 = uVar10;
    glu::CallLogWrapper::glGetActiveUniform
              (this_01,local_2d4,(GLuint)uVar10,uniformMaxNameLength,&reportedNameLength,
               &reportedSize,&reportedTypeGL,
               nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    GVar5 = glu::CallLogWrapper::glGetError(this_01);
    glu::checkError(GVar5,
                    "glGetActiveUniform(programGL, (GLuint)unifNdx, (GLsizei)uniformMaxNameLength, &reportedNameLength, &reportedSize, &reportedTypeGL, &nameBuffer[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                    ,0x5c6);
    dataType = glu::getDataTypeFromGLType(reportedTypeGL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reportedNameStr,
               nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,(allocator<char> *)local_230);
    if (dataType == TYPE_LAST) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid uniform type","reportedType != glu::TYPE_LAST",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                 ,0x5cb);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_230 = (undefined1  [8])pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::operator<<(&local_228,"// Got name = ");
    std::operator<<(&local_228,(string *)&reportedNameStr);
    std::operator<<(&local_228,", name length = ");
    std::ostream::operator<<((ostringstream *)&local_228,reportedNameLength);
    std::operator<<(&local_228,", size = ");
    std::ostream::operator<<((ostringstream *)&local_228,reportedSize);
    std::operator<<(&local_228,", type = ");
    pcVar8 = glu::getDataTypeName(dataType);
    std::operator<<(&local_228,pcVar8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    if (reportedNameLength != (int)reportedNameStr._M_string_length) {
      local_230 = (undefined1  [8])pTVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      std::operator<<(&local_228,"// FAILURE: wrong name length reported, should be ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
      bVar3 = false;
    }
    dVar6 = deStringBeginsWith(reportedNameStr._M_dataplus._M_p,"gl_");
    if (dVar6 == 0) {
      lVar14 = 0x20;
      lVar12 = 0;
      while( true ) {
        pBVar11 = (basicUniformReportsRef->
                  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        iVar7 = (int)(((long)(basicUniformReportsRef->
                             super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11) / 0x30);
        if (iVar7 <= lVar12) break;
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)pBVar11 + lVar14 + -0x20),&reportedNameStr);
        if (_Var4) {
          pBVar11 = (basicUniformReportsRef->
                    super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          iVar7 = (int)(((long)(basicUniformReportsRef->
                               super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11) / 0x30);
          break;
        }
        lVar12 = lVar12 + 1;
        lVar14 = lVar14 + 0x30;
      }
      pvVar2 = local_2c8;
      if ((int)lVar12 < iVar7) {
        cVar9 = BasicUniformReportGL::findWithName(local_2c8,reportedNameStr._M_dataplus._M_p);
        if (cVar9._M_current !=
            (pvVar2->
            super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_230 = (undefined1  [8])pTVar1;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
          std::operator<<(&local_228,"// FAILURE: same uniform name reported twice");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
          bVar3 = false;
        }
        BasicUniformReportGL::BasicUniformReportGL
                  ((BasicUniformReportGL *)local_230,reportedNameStr._M_dataplus._M_p,
                   reportedNameLength,reportedSize,dataType,(int)local_2c0);
        std::
        vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
        ::emplace_back<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>
                  (pvVar2,(BasicUniformReportGL *)local_230);
        std::__cxx11::string::~string((string *)local_230);
        if (dataType != *(DataType *)((long)&(pBVar11->name)._M_string_length + lVar14)) {
          local_230 = (undefined1  [8])pTVar1;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
          std::operator<<(&local_228,"// FAILURE: wrong type reported, should be ");
          pcVar8 = glu::getDataTypeName
                             (*(DataType *)((long)&(pBVar11->name)._M_string_length + lVar14));
          std::operator<<(&local_228,pcVar8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
          bVar3 = false;
        }
        if ((*(int *)((long)&(pBVar11->name)._M_dataplus._M_p + lVar14) <= reportedSize) &&
           (reportedSize <= *(int *)((long)&(pBVar11->name)._M_dataplus._M_p + lVar14 + 4)))
        goto LAB_010a9184;
        local_230 = (undefined1  [8])pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
        std::operator<<(&local_228,"// FAILURE: wrong size reported, should be ");
        value = (int *)((long)&(pBVar11->name)._M_dataplus._M_p + lVar14);
        iVar7 = *value;
        local_2d8 = value[1];
        if (iVar7 == local_2d8) {
          de::toString<int>(&local_250,value);
        }
        else {
          de::toString<int>(&local_90,value);
          std::operator+(&local_70,"in the range [",&local_90);
          std::operator+(&local_270,&local_70,", ");
          de::toString<int>(&local_b0,(int *)((long)&(pBVar11->name)._M_dataplus._M_p + lVar14 + 4))
          ;
          std::operator+(&local_50,&local_270,&local_b0);
          std::operator+(&local_250,&local_50,"]");
        }
        std::operator<<(&local_228,(string *)&local_250);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_250);
        if (iVar7 != local_2d8) {
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
      else {
        local_230 = (undefined1  [8])pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
        std::operator<<(&local_228,"// FAILURE: invalid non-built-in uniform name reported");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
      bVar3 = false;
    }
LAB_010a9184:
    std::__cxx11::string::~string((string *)&reportedNameStr);
    uVar10 = (ulong)((int)local_2c0 + 1);
  } while( true );
}

Assistant:

bool UniformCase::getActiveUniforms (vector<BasicUniformReportGL>& basicUniformReportsDst, const vector<BasicUniformReportRef>& basicUniformReportsRef, const deUint32 programGL)
{
	TestLog&			log						= m_testCtx.getLog();
	GLint				numActiveUniforms		= 0;
	GLint				uniformMaxNameLength	= 0;
	vector<char>		nameBuffer;
	bool				success					= true;

	GLU_CHECK_CALL(glGetProgramiv(programGL, GL_ACTIVE_UNIFORMS, &numActiveUniforms));
	log << TestLog::Message << "// Number of active uniforms reported: " << numActiveUniforms << TestLog::EndMessage;
	GLU_CHECK_CALL(glGetProgramiv(programGL, GL_ACTIVE_UNIFORM_MAX_LENGTH, &uniformMaxNameLength));
	log << TestLog::Message << "// Maximum uniform name length reported: " << uniformMaxNameLength << TestLog::EndMessage;
	nameBuffer.resize(uniformMaxNameLength);

	for (int unifNdx = 0; unifNdx < numActiveUniforms; unifNdx++)
	{
		GLsizei					reportedNameLength	= 0;
		GLint					reportedSize		= -1;
		GLenum					reportedTypeGL		= GL_NONE;

		GLU_CHECK_CALL(glGetActiveUniform(programGL, (GLuint)unifNdx, (GLsizei)uniformMaxNameLength, &reportedNameLength, &reportedSize, &reportedTypeGL, &nameBuffer[0]));

		const glu::DataType		reportedType		= glu::getDataTypeFromGLType(reportedTypeGL);
		const string			reportedNameStr		(&nameBuffer[0]);

		TCU_CHECK_MSG(reportedType != glu::TYPE_LAST, "Invalid uniform type");

		log << TestLog::Message << "// Got name = " << reportedNameStr << ", name length = " << reportedNameLength << ", size = " << reportedSize << ", type = " << glu::getDataTypeName(reportedType) << TestLog::EndMessage;

		if ((GLsizei)reportedNameStr.length() != reportedNameLength)
		{
			log << TestLog::Message << "// FAILURE: wrong name length reported, should be " << reportedNameStr.length() << TestLog::EndMessage;
			success = false;
		}

		if (!deStringBeginsWith(reportedNameStr.c_str(), "gl_")) // Ignore built-in uniforms.
		{
			int referenceNdx;
			for (referenceNdx = 0; referenceNdx < (int)basicUniformReportsRef.size(); referenceNdx++)
			{
				if (basicUniformReportsRef[referenceNdx].name == reportedNameStr)
					break;
			}

			if (referenceNdx >= (int)basicUniformReportsRef.size())
			{
				log << TestLog::Message << "// FAILURE: invalid non-built-in uniform name reported" << TestLog::EndMessage;
				success = false;
			}
			else
			{
				const BasicUniformReportRef& reference = basicUniformReportsRef[referenceNdx];

				DE_ASSERT(reference.type != glu::TYPE_LAST);
				DE_ASSERT(reference.minSize >= 1 || (reference.minSize == 0 && !reference.isUsedInShader));
				DE_ASSERT(reference.minSize <= reference.maxSize);

				if (BasicUniformReportGL::findWithName(basicUniformReportsDst, reportedNameStr.c_str()) != basicUniformReportsDst.end())
				{
					log << TestLog::Message << "// FAILURE: same uniform name reported twice" << TestLog::EndMessage;
					success = false;
				}

				basicUniformReportsDst.push_back(BasicUniformReportGL(reportedNameStr.c_str(), reportedNameLength, reportedSize, reportedType, unifNdx));

				if (reportedType != reference.type)
				{
					log << TestLog::Message << "// FAILURE: wrong type reported, should be " << glu::getDataTypeName(reference.type) << TestLog::EndMessage;
					success = false;
				}
				if (reportedSize < reference.minSize || reportedSize > reference.maxSize)
				{
					log << TestLog::Message
						<< "// FAILURE: wrong size reported, should be "
						<< (reference.minSize == reference.maxSize ? de::toString(reference.minSize) : "in the range [" + de::toString(reference.minSize) + ", " + de::toString(reference.maxSize) + "]")
						<< TestLog::EndMessage;

					success = false;
				}
			}
		}
	}

	for (int i = 0; i < (int)basicUniformReportsRef.size(); i++)
	{
		const BasicUniformReportRef& expected = basicUniformReportsRef[i];
		if (expected.isUsedInShader && BasicUniformReportGL::findWithName(basicUniformReportsDst, expected.name.c_str()) == basicUniformReportsDst.end())
		{
			log << TestLog::Message << "// FAILURE: uniform with name " << expected.name << " was not reported by GL" << TestLog::EndMessage;
			success = false;
		}
	}

	return success;
}